

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

int test_connect_impl(char *file,int line,int sock,char *address)

{
  int iVar1;
  undefined4 in_register_00000014;
  
  iVar1 = nn_connect(line,CONCAT44(in_register_00000014,sock));
  if (-1 < iVar1) {
    return iVar1;
  }
  test_connect_impl_cold_1();
}

Assistant:

static int NN_UNUSED test_connect_impl (char *file, int line,
    int sock, char *address)
{
    int rc;

    rc = nn_connect (sock, address);
    if(rc < 0) {
        fprintf (stderr, "Failed connect to \"%s\": %s [%d] (%s:%d)\n",
            address,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}